

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::HttpClient::openWebSocket(HttpClient *this,StringPtr url,HttpHeaders *headers)

{
  HttpHeaders *pHVar1;
  undefined8 in_R8;
  Maybe<unsigned_long> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  HttpHeaders *pHStack_50;
  undefined1 local_48 [32];
  HttpHeaders *headers_local;
  HttpClient *this_local;
  StringPtr url_local;
  
  pHVar1 = (HttpHeaders *)url.content.ptr;
  this_local._0_4_ = (undefined4)url.content.size_;
  this_local._4_4_ = url.content.size_._4_4_;
  local_58 = this_local._0_4_;
  uStack_54 = this_local._4_4_;
  headers_local = pHVar1;
  this_local = (HttpClient *)url.content.size_;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  pHStack_50 = headers;
  Maybe<unsigned_long>::Maybe();
  (*(code *)(pHVar1->table->namesById).builder.ptr)
            (local_48,pHVar1,0,CONCAT44(uStack_54,local_58),pHStack_50,in_R8,&local_68);
  Promise<kj::HttpClient::Response>::
  then<kj::HttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::__0>
            ((Promise<kj::HttpClient::Response> *)this,(Type *)(local_48 + 0x10));
  Request::~Request((Request *)local_48);
  Maybe<unsigned_long>::~Maybe(&local_68);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<HttpClient::WebSocketResponse> HttpClient::openWebSocket(
    kj::StringPtr url, const HttpHeaders& headers) {
  return request(HttpMethod::GET, url, headers, kj::none)
      .response.then([](HttpClient::Response&& response) -> WebSocketResponse {
    kj::OneOf<kj::Own<kj::AsyncInputStream>, kj::Own<WebSocket>> body;
    body.init<kj::Own<kj::AsyncInputStream>>(kj::mv(response.body));

    return {
      response.statusCode,
      response.statusText,
      response.headers,
      kj::mv(body)
    };
  });
}